

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::range_query(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *this,pair<unsigned_long_long,_int> *keyl,pair<unsigned_long_long,_int> *keyr)

{
  unsigned_long_long *puVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong *in_RCX;
  ulong uVar5;
  long lVar6;
  ulong extraout_RDX;
  ulong uVar7;
  ulong extraout_RDX_00;
  int iVar8;
  ulong unaff_RBP;
  int *piVar9;
  long unaff_R12;
  bool bVar10;
  undefined1 auVar11 [16];
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> vVar12;
  locType pos;
  undefined8 local_58;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_50;
  pair<const_std::pair<unsigned_long_long,_int>,_long> local_48;
  
  *(undefined4 *)((long)&this->root + 4) = 10;
  pvVar4 = operator_new(0xf0);
  *(void **)this = pvVar4;
  *(undefined4 *)&this->root = 0;
  uVar7 = extraout_RDX;
  if ((int)keyl->first == 0) {
LAB_00112c94:
    vVar12.currentLength = (int)uVar7;
    vVar12.maxSize = (int)(uVar7 >> 0x20);
    vVar12.data = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)this;
    return vVar12;
  }
  local_58 = *(undefined8 *)&keyl->second;
  local_50 = this;
  if (0 < (int)keyl->first) {
    iVar8 = 0;
    do {
      auVar11 = (**(code **)(*(long *)keyl[1].first + 0x10))((long *)keyl[1].first,&local_58);
      uVar7 = auVar11._8_8_;
      unaff_R12 = auVar11._0_8_;
      uVar2 = *(uint *)(unaff_R12 + 0x958);
      bVar10 = 0 < (int)uVar2;
      if ((int)uVar2 < 1) {
        unaff_RBP = 0;
      }
      else {
        uVar7 = keyr->first;
        piVar9 = (int *)(unaff_R12 + 0x330);
        unaff_RBP = 0;
        do {
          if ((uVar7 <= *(ulong *)(piVar9 + -2)) &&
             ((uVar7 < *(ulong *)(piVar9 + -2) || (keyr->second <= *piVar9)))) goto LAB_00112bb8;
          unaff_RBP = unaff_RBP + 1;
          bVar10 = unaff_RBP < uVar2;
          piVar9 = piVar9 + 4;
        } while (uVar2 != unaff_RBP);
        unaff_RBP = (ulong)uVar2;
      }
LAB_00112bb8:
      if (iVar8 < (int)keyl->first + -1) {
        uVar5 = unaff_RBP & 0xffffffff;
        if (bVar10) {
          uVar7 = keyr->first;
          uVar3 = *(ulong *)(unaff_R12 + 0x328 + uVar5 * 0x10);
          if ((uVar3 <= uVar7) &&
             ((uVar3 < uVar7 ||
              (uVar7 = (ulong)(uint)keyr->second,
              *(int *)(uVar5 * 0x10 + unaff_R12 + 0x330) <= keyr->second)))) {
            local_58 = *(undefined8 *)(unaff_R12 + 8 + uVar5 * 8);
            goto LAB_00112be7;
          }
        }
        local_58 = *(undefined8 *)(unaff_R12 + uVar5 * 8);
      }
LAB_00112be7:
      iVar8 = iVar8 + 1;
    } while (iVar8 < (int)keyl->first);
  }
  this = local_50;
  do {
    iVar8 = (int)unaff_RBP;
    if (iVar8 == *(int *)(unaff_R12 + 0x958)) {
      if (*(long *)(unaff_R12 + 800) == -1) goto LAB_00112c94;
      unaff_R12 = (**(code **)(*(long *)keyl[1].first + 0x10))
                            ((long *)keyl[1].first,unaff_R12 + 800);
      iVar8 = 0;
    }
    lVar6 = (long)iVar8 * 0x10;
    uVar7 = *in_RCX;
    uVar5 = *(ulong *)(unaff_R12 + 0x328 + lVar6);
    if ((uVar7 < uVar5) ||
       ((puVar1 = (unsigned_long_long *)(unaff_R12 + 0x328 + lVar6), uVar7 <= uVar5 &&
        (uVar7 = (ulong)(uint)in_RCX[1], (int)(uint)in_RCX[1] < (int)puVar1[1]))))
    goto LAB_00112c94;
    local_48.second = *(long *)(unaff_R12 + (long)iVar8 * 8);
    local_48.first.first = *puVar1;
    local_48.first._8_8_ = puVar1[1];
    vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::push_back
              ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)this,&local_48)
    ;
    unaff_RBP = (ulong)(iVar8 + 1);
    uVar7 = extraout_RDX_00;
  } while( true );
}

Assistant:

vector<value_type> range_query(const Key &keyl, const Key &keyr) {
            vector<value_type> ret;
            if (!depth)return ret;
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], keyl); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(keyl, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            while (1) {
                if (j == x->sz) {
                    if (x->nxt == -1)break;
                    x = file->read(x->nxt);
                    j = 0;
                }
                if (Compare()(keyr, x->keyvalue[j]))break;
                ret.push_back(std::make_pair(x->keyvalue[j], x->val[j]));
                ++j;
            }
            return ret;
        }